

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_java_struct_reader(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,
                           "public void read(org.apache.thrift.protocol.TProtocol iprot) throws org.apache.thrift.TException {"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"scheme(iprot).read(iprot, this);");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"}");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_reader(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << "public void read(org.apache.thrift.protocol.TProtocol iprot) throws "
                 "org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "scheme(iprot).read(iprot, this);" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}